

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ConstantPaddingLayerParams::InternalSwap
          (ConstantPaddingLayerParams *this,ConstantPaddingLayerParams *other)

{
  bool bVar1;
  float fVar2;
  intptr_t iVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar3;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other_00);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar7 = (this->padamounts_).current_size_;
  iVar8 = (this->padamounts_).total_size_;
  pvVar4 = (this->padamounts_).arena_or_elements_;
  iVar6 = (other->padamounts_).total_size_;
  pvVar5 = (other->padamounts_).arena_or_elements_;
  (this->padamounts_).current_size_ = (other->padamounts_).current_size_;
  (this->padamounts_).total_size_ = iVar6;
  (this->padamounts_).arena_or_elements_ = pvVar5;
  (other->padamounts_).current_size_ = iVar7;
  (other->padamounts_).total_size_ = iVar8;
  (other->padamounts_).arena_or_elements_ = pvVar4;
  fVar2 = this->value_;
  this->value_ = other->value_;
  other->value_ = fVar2;
  bVar1 = this->padtogivenoutputsizemode_;
  this->padtogivenoutputsizemode_ = other->padtogivenoutputsizemode_;
  other->padtogivenoutputsizemode_ = bVar1;
  return;
}

Assistant:

void ConstantPaddingLayerParams::InternalSwap(ConstantPaddingLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  padamounts_.InternalSwap(&other->padamounts_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(ConstantPaddingLayerParams, padtogivenoutputsizemode_)
      + sizeof(ConstantPaddingLayerParams::padtogivenoutputsizemode_)
      - PROTOBUF_FIELD_OFFSET(ConstantPaddingLayerParams, value_)>(
          reinterpret_cast<char*>(&value_),
          reinterpret_cast<char*>(&other->value_));
}